

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O1

void anon_unknown.dwarf_1ee5cf::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  WritingTaskData *pWVar1;
  WritingTaskData *pWVar2;
  LineOrder LVar3;
  Compression CVar4;
  pointer pcVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Header *pHVar11;
  long *plVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  int iVar21;
  ostream *poVar22;
  ChannelList *pCVar23;
  TileDescription *tileDesc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  pointer *__dest;
  Task *pTVar28;
  Header *pHVar29;
  Box2i *pBVar30;
  Box2i *pBVar31;
  float *pfVar32;
  V2f *pVVar33;
  V2f *pVVar34;
  LineOrder *pLVar35;
  Compression *pCVar36;
  ConstIterator CVar37;
  Iterator IVar38;
  ChannelList *other;
  string *psVar39;
  string *psVar40;
  ThreadPool *this;
  undefined4 uVar41;
  ulong *puVar42;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *p_Var43;
  pointer pWVar44;
  size_type *psVar45;
  Array2D<Imf_2_5::FrameBuffer> *pAVar46;
  ulong uVar47;
  undefined1 *type;
  size_type sVar48;
  ulong uVar49;
  void *pvVar50;
  FrameBuffer *pFVar51;
  long lVar52;
  ulong uVar53;
  size_type *psVar54;
  uint uVar55;
  Header *this_00;
  long lVar56;
  size_t sVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<float> floatData;
  TaskGroup taskGroup;
  MultiPartOutputFile file;
  Array2D<unsigned_int> uintData;
  Array2D<half> halfData;
  Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_> tiledFrameBuffers;
  string fn;
  vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> frameBuffers;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  int *numXTiles;
  vector<void_*,_std::allocator<void_*>_> parts;
  pointer *local_3a0;
  string local_398;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *local_378;
  ulong local_370;
  pointer *local_368;
  uint local_35c;
  Array2D<float> local_358;
  ulong local_338;
  uint local_32c;
  ulong local_328;
  ulong local_320;
  ThreadPool *local_318;
  int local_310 [2];
  MultiPartOutputFile local_308;
  Array2D<unsigned_int> local_2f8;
  Array2D<half> local_2d8;
  Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_> local_2b8;
  size_type *local_2a8;
  size_type *local_2a0;
  size_type *local_298;
  size_type *local_290;
  long *local_288 [2];
  long local_278 [2];
  int local_264;
  int local_260;
  int local_25c;
  undefined1 local_258 [16];
  _Base_ptr local_248;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  local_218;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  local_1f8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_t local_1d0;
  ulong local_1c8;
  long local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  local_260 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_35c = partNumber;
  poVar22 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar22," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
  std::ostream::put((char)poVar22);
  std::ostream::flush();
  std::ostream::flush();
  local_288[0] = local_278;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_288);
  local_264 = runCount;
  if (0 < runCount) {
    local_338 = (ulong)local_35c;
    local_1c8 = local_338 * 0x18 + 8;
    local_1d0 = ((local_338 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar13 = 0;
    do {
      local_25c = iVar13;
      local_2d8._data = (half *)0x0;
      local_2d8._sizeX = 0;
      local_2d8._sizeY = 0;
      local_358._data = (float *)0x0;
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_2f8._data = (uint *)0x0;
      local_2f8._sizeX = 0;
      local_2f8._sizeY = 0;
      fillPixels<unsigned_int>(&local_2f8,0xc5,0x107);
      fillPixels<half>(&local_2d8,0xc5,0x107);
      fillPixels<float>(&local_358,0xc5,0x107);
      uVar47 = local_1c8;
      local_2a8 = (size_type *)operator_new__(local_1c8);
      sVar57 = local_1d0;
      uVar53 = local_338;
      *local_2a8 = local_338;
      local_290 = local_2a8 + 1;
      memset(local_290,0,local_1d0);
      local_1d8 = (size_type *)operator_new__(uVar47);
      *local_1d8 = uVar53;
      local_298 = local_1d8 + 1;
      memset(local_298,0,sVar57);
      local_1e0 = (size_type *)operator_new__(uVar47);
      *local_1e0 = uVar53;
      local_2a0 = local_1e0 + 1;
      memset(local_2a0,0,sVar57);
      local_218.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_start = (WritingTaskData *)0x0;
      local_218.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar53);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_338);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_338);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar11 = DAT_0043ecc0;
      pHVar29 = (anonymous_namespace)::headers;
      this_00 = (anonymous_namespace)::headers;
      if (DAT_0043ecc0 != (anonymous_namespace)::headers) {
        do {
          Imf_2_5::Header::~Header(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != pHVar11);
        DAT_0043ecc0 = pHVar29;
      }
      if (0 < (int)local_35c) {
        sVar48 = 0;
        do {
          local_1b8._0_4_ = 0.0;
          local_1b8._4_4_ = 0.0;
          Imf_2_5::Header::Header
                    ((Header *)local_258,0xc5,0x107,1.0,(V2f *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar13 = random_int(3);
          iVar14 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar48 * 4) = iVar13;
          *(int *)((anonymous_namespace)::partTypes + sVar48 * 4) = iVar14;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar19 = (int)sVar48;
          std::ostream::operator<<(&local_1a8,iVar19);
          std::__cxx11::stringbuf::str();
          Imf_2_5::Header::setName((Header *)local_258,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if (iVar13 == 0) {
            pCVar23 = Imf_2_5::Header::channels((Header *)local_258);
            Imf_2_5::Channel::Channel((Channel *)&local_398,UINT,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar23,"UINT",(Channel *)&local_398);
          }
          else if (iVar13 == 1) {
            pCVar23 = Imf_2_5::Header::channels((Header *)local_258);
            Imf_2_5::Channel::Channel((Channel *)&local_398,FLOAT,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar23,"FLOAT",(Channel *)&local_398);
          }
          else if (iVar13 == 2) {
            pCVar23 = Imf_2_5::Header::channels((Header *)local_258);
            Imf_2_5::Channel::Channel((Channel *)&local_398,HALF,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar23,"HALF",(Channel *)&local_398);
          }
          bVar58 = true;
          type = Imf_2_5::SCANLINEIMAGE_abi_cxx11_;
          if (iVar14 == 0) {
LAB_00173869:
            Imf_2_5::Header::setType((Header *)local_258,(string *)type);
            if (iVar14 == 1) {
              iVar13 = random_int(0xc5);
              iVar15 = random_int(0x107);
              uVar16 = random_int(3);
              *(uint *)((anonymous_namespace)::levelModes + sVar48 * 4) = uVar16;
              uVar55 = 3;
              if (uVar16 < 3) {
                uVar55 = uVar16;
              }
              local_398._M_dataplus._M_p._4_4_ = iVar15 + 1;
              local_398._M_dataplus._M_p._0_4_ = iVar13 + 1;
              local_398._M_string_length = (size_type)uVar55;
              Imf_2_5::Header::setTileDescription((Header *)local_258,(TileDescription *)&local_398)
              ;
              bVar58 = uVar16 != 1;
            }
          }
          else if (iVar14 == 1) {
            type = Imf_2_5::TILEDIMAGE_abi_cxx11_;
            goto LAB_00173869;
          }
          if (iVar14 == 0) {
            iVar13 = 0x107;
            do {
              local_398._M_dataplus._M_p._0_4_ = iVar19;
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back(&local_218,(value_type *)&local_398);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          else {
            tileDesc = Imf_2_5::Header::tileDescription((Header *)local_258);
            Imf_2_5::precalculateTileInfo
                      (tileDesc,0,0xc4,0,0x106,(int **)&local_1f8,(int **)&local_308,
                       (int *)&local_2b8,local_310);
            if (0 < (int)local_2b8._size) {
              lVar56 = 0;
              do {
                if (0 < local_310[0]) {
                  lVar52 = 0;
                  do {
                    if ((!(bool)(~bVar58 & lVar56 != lVar52)) &&
                       (0 < *(int *)((long)local_1f8.
                                           super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar56 * 4)))
                    {
                      iVar13 = 0;
                      do {
                        if (0 < *(int *)((long)local_308.super_GenericOutputFile.
                                               _vptr_GenericOutputFile + lVar52 * 4)) {
                          iVar14 = 0;
                          do {
                            local_398._M_dataplus._M_p = (pointer)CONCAT44(iVar13,iVar19);
                            local_398._M_string_length = CONCAT44((int)lVar56,iVar14);
                            local_398.field_2._M_allocated_capacity._0_4_ = (int)lVar52;
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back(&local_218,(value_type *)&local_398);
                            iVar14 = iVar14 + 1;
                          } while (iVar14 < *(int *)((long)local_308.super_GenericOutputFile.
                                                           _vptr_GenericOutputFile + lVar52 * 4));
                        }
                        iVar13 = iVar13 + 1;
                      } while (iVar13 < *(int *)((long)local_1f8.
                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                lVar56 * 4));
                    }
                    lVar52 = lVar52 + 1;
                  } while (lVar52 < local_310[0]);
                }
                lVar56 = lVar56 + 1;
              } while (lVar56 < (int)local_2b8._size);
            }
            if (local_1f8.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete__(local_1f8.
                                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_308.super_GenericOutputFile._vptr_GenericOutputFile != (_func_int **)0x0) {
              operator_delete__(local_308.super_GenericOutputFile._vptr_GenericOutputFile);
            }
          }
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)local_258);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_2_5::Header::~Header((Header *)local_258);
          sVar48 = sVar48 + 1;
        } while (sVar48 != local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pWVar44 = local_218.
                super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_328 = ((long)local_218.
                         super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_218.
                         super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," tasks ",7);
      std::ostream::flush();
      uVar53 = local_328 & 0xffffffff;
      if (0 < (int)local_328) {
        do {
          iVar13 = (int)local_328;
          iVar17 = random_int(iVar13);
          iVar18 = random_int(iVar13);
          iVar13 = pWVar44[iVar17].ly;
          local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,iVar13);
          pWVar1 = pWVar44 + iVar17;
          local_1b8._0_4_ = pWVar1->partNumber;
          local_1b8._4_4_ = pWVar1->tx;
          uStack_1b0 = *(Data **)&pWVar1->ty;
          pWVar44[iVar17].ly = pWVar44[iVar18].ly;
          pWVar1 = pWVar44 + iVar18;
          iVar14 = pWVar1->tx;
          iVar19 = pWVar1->ty;
          iVar15 = pWVar1->lx;
          pWVar2 = pWVar44 + iVar17;
          pWVar2->partNumber = pWVar1->partNumber;
          pWVar2->tx = iVar14;
          pWVar2->ty = iVar19;
          pWVar2->lx = iVar15;
          pWVar44[iVar18].ly = iVar13;
          pWVar1 = pWVar44 + iVar18;
          pWVar1->partNumber = local_1b8._0_4_;
          pWVar1->tx = local_1b8._4_4_;
          *(Data **)&pWVar1->ty = uStack_1b0;
          uVar55 = (int)uVar53 - 1;
          uVar53 = (ulong)uVar55;
        } while (uVar55 != 0);
      }
      remove((char *)local_288[0]);
      plVar12 = local_288[0];
      pHVar11 = DAT_0043ecc0;
      pHVar29 = (anonymous_namespace)::headers;
      iVar13 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
                (&local_308,(char *)plVar12,pHVar29,
                 (int)((ulong)((long)pHVar11 - (long)pHVar29) >> 3) * -0x49249249,false,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar53 = local_338;
      local_1b8._0_4_ = 0.0;
      local_1b8._4_4_ = 0.0;
      uStack_1b0 = (Data *)0x0;
      local_1a8 = (_Base_ptr)0x0;
      std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::vector
                ((vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> *)local_258,
                 local_338,(allocator_type *)&local_398);
      Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::Array(&local_2b8,uVar53);
      if (0 < (int)local_35c) {
        uVar53 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar53 * 4) == 0) {
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(8);
            Imf_2_5::OutputPart::OutputPart
                      ((OutputPart *)&paVar24->_M_allocated_capacity,&local_308,(int)uVar53);
            local_398._M_dataplus._M_p = (pointer)paVar24;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)&local_398);
            pFVar51 = (FrameBuffer *)(local_258._0_8_ + uVar53 * 0x30);
            setOutputFrameBuffer
                      (pFVar51,*(int *)((anonymous_namespace)::pixelTypes + uVar53 * 4),&local_2f8,
                       &local_358,&local_2d8,0xc5);
            Imf_2_5::OutputPart::setFrameBuffer
                      ((OutputPart *)&paVar24->_M_allocated_capacity,pFVar51);
          }
          else {
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(8);
            Imf_2_5::TiledOutputPart::TiledOutputPart
                      ((TiledOutputPart *)&paVar24->_M_allocated_capacity,&local_308,(int)uVar53);
            local_398._M_dataplus._M_p = (pointer)paVar24;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)&local_398);
            uVar55 = Imf_2_5::TiledOutputPart::numXLevels
                               ((TiledOutputPart *)&paVar24->_M_allocated_capacity);
            uVar47 = (ulong)uVar55;
            local_32c = Imf_2_5::TiledOutputPart::numYLevels
                                  ((TiledOutputPart *)&paVar24->_M_allocated_capacity);
            iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar53 * 4);
            local_378 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)(long)(int)local_32c;
            local_370 = (ulong)(int)uVar55;
            local_320 = CONCAT44(local_320._4_4_,uVar55);
            if (iVar13 == 0) {
              uVar49 = (long)local_378 * local_370;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar49;
              uVar25 = SUB168(auVar9 * ZEXT816(0x18),0);
              uVar26 = uVar25 + 8;
              if (0xfffffffffffffff7 < uVar25) {
                uVar26 = 0xffffffffffffffff;
              }
              if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
                uVar26 = 0xffffffffffffffff;
              }
              puVar27 = (ulong *)operator_new__(uVar26);
              *puVar27 = uVar49;
              puVar27 = puVar27 + 1;
              if (uVar49 != 0) {
                memset(puVar27,0,((uVar49 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              psVar45 = local_2a0 + uVar53 * 3;
              sVar48 = psVar45[2];
              if (sVar48 != 0) {
                lVar56 = *(long *)(sVar48 - 8);
                pvVar50 = (void *)(sVar48 - 8);
                if (lVar56 != 0) {
                  lVar52 = lVar56 * 0x18;
                  do {
                    if (*(void **)((long)pvVar50 + lVar52) != (void *)0x0) {
                      operator_delete__(*(void **)((long)pvVar50 + lVar52));
                    }
                    lVar52 = lVar52 + -0x18;
                  } while (lVar52 != 0);
                }
LAB_00173ff9:
                operator_delete__(pvVar50,lVar56 * 0x18 + 8);
                uVar47 = local_320 & 0xffffffff;
              }
LAB_00174020:
              *psVar45 = (size_type)local_378;
              psVar45[1] = local_370;
              psVar45[2] = (size_type)puVar27;
            }
            else {
              if (iVar13 == 1) {
                uVar49 = (long)local_378 * local_370;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar49;
                uVar25 = SUB168(auVar8 * ZEXT816(0x18),0);
                uVar26 = uVar25 + 8;
                if (0xfffffffffffffff7 < uVar25) {
                  uVar26 = 0xffffffffffffffff;
                }
                if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
                  uVar26 = 0xffffffffffffffff;
                }
                puVar27 = (ulong *)operator_new__(uVar26);
                *puVar27 = uVar49;
                puVar27 = puVar27 + 1;
                if (uVar49 != 0) {
                  memset(puVar27,0,((uVar49 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
                }
                psVar45 = local_298 + uVar53 * 3;
                sVar48 = psVar45[2];
                if (sVar48 != 0) {
                  lVar56 = *(long *)(sVar48 - 8);
                  pvVar50 = (void *)(sVar48 - 8);
                  if (lVar56 != 0) {
                    lVar52 = lVar56 * 0x18;
                    do {
                      if (*(void **)((long)pvVar50 + lVar52) != (void *)0x0) {
                        operator_delete__(*(void **)((long)pvVar50 + lVar52));
                      }
                      lVar52 = lVar52 + -0x18;
                    } while (lVar52 != 0);
                  }
                  goto LAB_00173ff9;
                }
                goto LAB_00174020;
              }
              if (iVar13 == 2) {
                uVar49 = (long)local_378 * local_370;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar49;
                uVar25 = SUB168(auVar7 * ZEXT816(0x18),0);
                uVar26 = uVar25 + 8;
                if (0xfffffffffffffff7 < uVar25) {
                  uVar26 = 0xffffffffffffffff;
                }
                if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
                  uVar26 = 0xffffffffffffffff;
                }
                puVar27 = (ulong *)operator_new__(uVar26);
                *puVar27 = uVar49;
                puVar27 = puVar27 + 1;
                if (uVar49 != 0) {
                  memset(puVar27,0,((uVar49 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
                }
                psVar45 = local_290 + uVar53 * 3;
                sVar48 = psVar45[2];
                if (sVar48 != 0) {
                  lVar56 = *(long *)(sVar48 - 8);
                  pvVar50 = (void *)(sVar48 - 8);
                  if (lVar56 != 0) {
                    lVar52 = lVar56 * 0x18;
                    do {
                      if (*(void **)((long)pvVar50 + lVar52) != (void *)0x0) {
                        operator_delete__(*(void **)((long)pvVar50 + lVar52));
                      }
                      lVar52 = lVar52 + -0x18;
                    } while (lVar52 != 0);
                  }
                  goto LAB_00173ff9;
                }
                goto LAB_00174020;
              }
            }
            uVar26 = (long)local_378 * local_370;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar26;
            uVar25 = SUB168(auVar10 * ZEXT816(0x30),0) | 8;
            if (SUB168(auVar10 * ZEXT816(0x30),8) != 0) {
              uVar25 = 0xffffffffffffffff;
            }
            local_1c0 = uVar53 * 3;
            pAVar46 = local_2b8._data + uVar53;
            puVar27 = (ulong *)operator_new__(uVar25);
            *puVar27 = uVar26;
            if (uVar26 != 0) {
              lVar56 = uVar26 * 0x30;
              puVar42 = puVar27 + 2;
              do {
                *(undefined4 *)puVar42 = 0;
                puVar42[1] = 0;
                puVar42[2] = (ulong)puVar42;
                puVar42[3] = (ulong)puVar42;
                puVar42[4] = 0;
                puVar42 = puVar42 + 6;
                lVar56 = lVar56 + -0x30;
              } while (lVar56 != 0);
            }
            pFVar51 = pAVar46->_data;
            if (pFVar51 != (FrameBuffer *)0x0) {
              local_368 = (pointer *)
                          pFVar51[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (local_368 != (pointer *)0x0) {
                lVar56 = (long)local_368 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                               *)(&pFVar51[-1]._map._M_t._M_impl.field_0x0 + lVar56));
                  lVar56 = lVar56 + -0x30;
                } while (lVar56 != 0);
              }
              operator_delete__(&pFVar51[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (long)local_368 * 0x30 + 8);
              uVar47 = local_320 & 0xffffffff;
            }
            pAVar46->_sizeX = (long)local_378;
            pAVar46->_sizeY = local_370;
            pAVar46->_data = (FrameBuffer *)(puVar27 + 1);
            if (0 < (int)local_370) {
              local_368 = (pointer *)(local_290 + uVar53 * 3);
              local_318 = (ThreadPool *)(local_298 + uVar53 * 3);
              local_378 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                           *)(local_2a0 + uVar53 * 3);
              local_370 = (ulong)local_32c;
              uVar25 = 0;
              local_320 = uVar47;
              do {
                if (0 < (int)local_32c) {
                  uVar47 = 0;
                  do {
                    bVar58 = Imf_2_5::TiledOutputPart::isValidLevel
                                       ((TiledOutputPart *)&paVar24->_M_allocated_capacity,
                                        (int)uVar25,(int)uVar47);
                    if (bVar58) {
                      iVar14 = Imf_2_5::TiledOutputPart::levelWidth
                                         ((TiledOutputPart *)&paVar24->_M_allocated_capacity,
                                          (int)uVar25);
                      iVar19 = Imf_2_5::TiledOutputPart::levelHeight
                                         ((TiledOutputPart *)&paVar24->_M_allocated_capacity,
                                          (int)uVar47);
                      lVar56 = (&(local_2b8._data)->_sizeY)[local_1c0];
                      pFVar51 = (&(local_2b8._data)->_data)[local_1c0];
                      iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar53 * 4);
                      if (iVar13 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   ((local_378->_M_impl).super__Vector_impl_data._M_end_of_storage +
                                   (long)(local_378->_M_impl).super__Vector_impl_data._M_finish *
                                   uVar47 * 3 + uVar25 * 3),iVar14,iVar19);
                      }
                      else if (iVar13 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (*(long *)(local_318 + 8) * uVar47 * 0x18 +
                                           *(long *)(local_318 + 0x10) + uVar25 * 0x18),iVar14,
                                          iVar19);
                      }
                      else if (iVar13 == 2) {
                        fillPixels<half>((Array2D<half> *)
                                         ((long)local_368[2] +
                                         uVar25 * 0x18 + (long)local_368[1] * uVar47 * 0x18),iVar14,
                                         iVar19);
                      }
                      setOutputFrameBuffer
                                (pFVar51 + lVar56 * uVar47 + uVar25,
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar53 * 4),
                                 (Array2D<unsigned_int> *)
                                 ((local_378->_M_impl).super__Vector_impl_data._M_end_of_storage +
                                 (long)(local_378->_M_impl).super__Vector_impl_data._M_finish *
                                 uVar47 * 3 + uVar25 * 3),
                                 (Array2D<float> *)
                                 (*(long *)(local_318 + 8) * uVar47 * 0x18 +
                                  *(long *)(local_318 + 0x10) + uVar25 * 0x18),
                                 (Array2D<half> *)
                                 ((long)local_368[2] +
                                 uVar25 * 0x18 + (long)local_368[1] * uVar47 * 0x18),iVar14);
                    }
                    uVar47 = uVar47 + 1;
                  } while (local_370 != uVar47);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != local_320);
            }
          }
          uVar53 = uVar53 + 1;
        } while (uVar53 != local_338);
      }
      IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)local_310);
      local_318 = (ThreadPool *)operator_new(0x10);
      IlmThread_2_5::ThreadPool::ThreadPool(local_318,0x20);
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_398.field_2._M_allocated_capacity = 0;
      if (0 < (int)(uint)local_328) {
        local_3a0 = (pointer *)0x0;
        uVar55 = (uint)local_328 - 1;
        local_328 = -(ulong)((uint)local_328 & 0x7fffffff);
        local_370 = -(ulong)uVar55;
        uVar53 = 0;
        uVar47 = 0;
        pWVar44 = local_218.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (local_398._M_string_length == local_398.field_2._M_allocated_capacity) {
            sVar57 = local_398._M_string_length - (long)local_3a0;
            if (sVar57 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar26 = (long)sVar57 >> 3;
            uVar25 = 1;
            if ((pointer *)local_398._M_string_length != local_3a0) {
              uVar25 = uVar26;
            }
            p_Var43 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar25 + uVar26);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < p_Var43) {
              p_Var43 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            local_378 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            if (!CARRY8(uVar25,uVar26)) {
              local_378 = p_Var43;
            }
            local_368 = (pointer *)local_398.field_2._M_allocated_capacity;
            __dest = (pointer *)
                     std::
                     _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     ::_M_allocate(local_378,(size_t)local_378);
            *(pointer *)((long)__dest + sVar57) = pWVar44;
            if (0 < (long)sVar57) {
              memmove(__dest,local_3a0,sVar57);
            }
            if (local_3a0 != (pointer *)0x0) {
              operator_delete(local_3a0,(long)local_368 - (long)local_3a0);
            }
            local_398._M_string_length = sVar57 + (long)__dest;
            local_398.field_2._M_allocated_capacity = (size_type)(__dest + (long)local_378);
            local_3a0 = __dest;
            local_398._M_dataplus._M_p = (pointer)__dest;
          }
          else {
            *(pointer *)local_398._M_string_length = pWVar44;
          }
          local_398._M_string_length = local_398._M_string_length + 8;
          if (((int)(uVar53 / 10) * -10 == (int)uVar47) || (local_370 == uVar47)) {
            pTVar28 = (Task *)operator_new(0x38);
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector(&local_1f8,
                     (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)&local_398);
            pAVar46 = local_2b8._data;
            IlmThread_2_5::Task::Task(pTVar28,(TaskGroup *)local_310);
            *(undefined ***)pTVar28 = &PTR__WritingTask_0043b208;
            *(MultiPartOutputFile **)(pTVar28 + 0x10) = &local_308;
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)(pTVar28 + 0x18),&local_1f8);
            *(Array2D<Imf_2_5::FrameBuffer> **)(pTVar28 + 0x30) = pAVar46;
            IlmThread_2_5::ThreadPool::addTask((Task *)local_318);
            if (local_1f8.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f8.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f8.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f8.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_398._M_string_length = (size_type)local_3a0;
          }
          uVar47 = uVar47 - 1;
          uVar53 = (ulong)((int)uVar53 + 1);
          pWVar44 = pWVar44 + 1;
        } while (local_328 != uVar47);
      }
      psVar45 = local_2a8;
      if (0 < (int)local_35c) {
        uVar53 = 0;
        do {
          pvVar50 = *(void **)((long)local_1b8 + uVar53 * 8);
          if (pvVar50 != (void *)0x0) {
            operator_delete(pvVar50,8);
          }
          uVar53 = uVar53 + 1;
        } while (local_338 != uVar53);
      }
      (**(code **)(*(long *)local_318 + 8))();
      sVar48 = *psVar45;
      if (sVar48 != 0) {
        psVar45 = local_2a8 + sVar48 * 3 + 1;
        do {
          sVar6 = psVar45[-1];
          if (sVar6 != 0) {
            lVar56 = *(long *)(sVar6 - 8);
            if (lVar56 != 0) {
              lVar52 = lVar56 * 0x18;
              do {
                pvVar50 = *(void **)((long)(sVar6 - 8) + lVar52);
                if (pvVar50 != (void *)0x0) {
                  operator_delete__(pvVar50);
                }
                lVar52 = lVar52 + -0x18;
              } while (lVar52 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar56 * 0x18 + 8);
          }
          psVar45 = psVar45 + -3;
        } while (psVar45 != local_290);
      }
      operator_delete__(local_2a8,sVar48 * 0x18 + 8);
      sVar48 = *local_1e0;
      psVar45 = local_1e0;
      if (sVar48 != 0) {
        psVar54 = local_1e0 + sVar48 * 3 + 1;
        do {
          sVar6 = psVar54[-1];
          if (sVar6 != 0) {
            lVar56 = *(long *)(sVar6 - 8);
            if (lVar56 != 0) {
              lVar52 = lVar56 * 0x18;
              do {
                pvVar50 = *(void **)((long)(sVar6 - 8) + lVar52);
                if (pvVar50 != (void *)0x0) {
                  operator_delete__(pvVar50);
                }
                lVar52 = lVar52 + -0x18;
              } while (lVar52 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar56 * 0x18 + 8);
            psVar45 = local_1e0;
          }
          psVar54 = psVar54 + -3;
        } while (psVar54 != local_2a0);
      }
      operator_delete__(psVar45,sVar48 * 0x18 + 8);
      sVar48 = *local_1d8;
      psVar45 = local_1d8;
      if (sVar48 != 0) {
        psVar54 = local_1d8 + sVar48 * 3 + 1;
        do {
          sVar6 = psVar54[-1];
          if (sVar6 != 0) {
            lVar56 = *(long *)(sVar6 - 8);
            if (lVar56 != 0) {
              lVar52 = lVar56 * 0x18;
              do {
                pvVar50 = *(void **)((long)(sVar6 - 8) + lVar52);
                if (pvVar50 != (void *)0x0) {
                  operator_delete__(pvVar50);
                }
                lVar52 = lVar52 + -0x18;
              } while (lVar52 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar56 * 0x18 + 8);
            psVar45 = local_1d8;
          }
          psVar54 = psVar54 + -3;
        } while (psVar54 != local_298);
      }
      operator_delete__(psVar45,sVar48 * 0x18 + 8);
      if ((pointer *)local_398._M_dataplus._M_p != (pointer *)0x0) {
        operator_delete(local_398._M_dataplus._M_p,
                        local_398.field_2._M_allocated_capacity - (long)local_398._M_dataplus._M_p);
      }
      IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)local_310);
      Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::~Array(&local_2b8);
      std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::~vector
                ((vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> *)local_258);
      if ((V2f)local_1b8 != (V2f)0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile(&local_308);
      if (local_218.
          super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ._M_impl.super__Vector_impl_data._M_start != (WritingTaskData *)0x0) {
        operator_delete(local_218.
                        super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2f8._data != (uint *)0x0) {
        operator_delete__(local_2f8._data);
      }
      if (local_358._data != (float *)0x0) {
        operator_delete__(local_358._data);
      }
      if (local_2d8._data != (half *)0x0) {
        operator_delete__(local_2d8._data);
      }
      plVar12 = local_288[0];
      local_248 = (_Base_ptr)0x0;
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (pointer)0x0;
      local_398.field_2._M_allocated_capacity = 0;
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_2d8._data = (half *)0x0;
      local_2d8._sizeX = 0;
      local_2d8._sizeY = 0;
      iVar13 = Imf_2_5::globalThreadCount();
      uVar53 = 1;
      Imf_2_5::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_2f8,(char *)plVar12,iVar13,true);
      lVar56 = 0;
      uVar47 = 0;
      while( true ) {
        uVar41 = (undefined4)uVar53;
        iVar13 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)&local_2f8);
        if ((ulong)(long)iVar13 <= uVar47) break;
        pHVar29 = Imf_2_5::MultiPartInputFile::header((MultiPartInputFile *)&local_2f8,(int)uVar47);
        pBVar30 = Imf_2_5::Header::displayWindow(pHVar29);
        pBVar31 = Imf_2_5::Header::displayWindow
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        iVar13 = -(uint)((pBVar31->min).x == (pBVar30->min).x);
        iVar14 = -(uint)((pBVar31->min).y == (pBVar30->min).y);
        auVar59._4_4_ = iVar13;
        auVar59._0_4_ = iVar13;
        auVar59._8_4_ = iVar14;
        auVar59._12_4_ = iVar14;
        iVar13 = movmskpd(uVar41,auVar59);
        if ((iVar13 != 3) ||
           (iVar14 = -(uint)((pBVar31->max).x == (pBVar30->max).x),
           iVar19 = -(uint)((pBVar31->max).y == (pBVar30->max).y), auVar60._4_4_ = iVar14,
           auVar60._0_4_ = iVar14, auVar60._8_4_ = iVar19, auVar60._12_4_ = iVar19,
           iVar14 = movmskpd((int)pBVar31,auVar60), iVar14 != 3)) {
          __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x292,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pBVar30 = Imf_2_5::Header::dataWindow(pHVar29);
        pBVar31 = Imf_2_5::Header::dataWindow
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        iVar14 = -(uint)((pBVar31->min).x == (pBVar30->min).x);
        iVar19 = -(uint)((pBVar31->min).y == (pBVar30->min).y);
        auVar61._4_4_ = iVar14;
        auVar61._0_4_ = iVar14;
        auVar61._8_4_ = iVar19;
        auVar61._12_4_ = iVar19;
        uVar55 = movmskpd(iVar13,auVar61);
        uVar53 = (ulong)uVar55;
        if ((uVar55 != 3) ||
           (iVar13 = -(uint)((pBVar31->max).x == (pBVar30->max).x),
           iVar14 = -(uint)((pBVar31->max).y == (pBVar30->max).y), auVar62._4_4_ = iVar13,
           auVar62._0_4_ = iVar13, auVar62._8_4_ = iVar14, auVar62._12_4_ = iVar14,
           iVar13 = movmskpd((int)pBVar31,auVar62), iVar13 != 3)) {
          __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x293,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = Imf_2_5::Header::pixelAspectRatio(pHVar29);
        fVar20 = *pfVar32;
        pfVar32 = Imf_2_5::Header::pixelAspectRatio
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        if ((fVar20 != *pfVar32) || (NAN(fVar20) || NAN(*pfVar32))) {
          __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x294,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pVVar33 = Imf_2_5::Header::screenWindowCenter(pHVar29);
        pVVar34 = Imf_2_5::Header::screenWindowCenter
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        if ((((pVVar33->x != pVVar34->x) || (NAN(pVVar33->x) || NAN(pVVar34->x))) ||
            (pVVar33->y != pVVar34->y)) || (NAN(pVVar33->y) || NAN(pVVar34->y))) {
          __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x295,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = Imf_2_5::Header::screenWindowWidth(pHVar29);
        fVar20 = *pfVar32;
        pfVar32 = Imf_2_5::Header::screenWindowWidth
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        if ((fVar20 != *pfVar32) || (NAN(fVar20) || NAN(*pfVar32))) {
          __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x296,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pLVar35 = Imf_2_5::Header::lineOrder(pHVar29);
        LVar3 = *pLVar35;
        pLVar35 = Imf_2_5::Header::lineOrder
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        if (LVar3 != *pLVar35) {
          __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pCVar36 = Imf_2_5::Header::compression(pHVar29);
        CVar4 = *pCVar36;
        pCVar36 = Imf_2_5::Header::compression
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        if (CVar4 != *pCVar36) {
          __assert_fail("header.compression() == headers[i].compression()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pCVar23 = Imf_2_5::Header::channels(pHVar29);
        CVar37 = Imf_2_5::ChannelList::begin(pCVar23);
        pCVar23 = Imf_2_5::Header::channels
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        IVar38 = Imf_2_5::ChannelList::begin(pCVar23);
        local_1b8 = *(undefined1 (*) [8])((long)CVar37._i._M_node + 0x120);
        uStack_1b0 = *(Data **)((long)CVar37._i._M_node + 0x128);
        local_358._sizeX = *(long *)((long)IVar38._i._M_node + 0x120);
        local_358._sizeY = *(long *)((long)IVar38._i._M_node + 0x128);
        bVar58 = Imf_2_5::Channel::operator==((Channel *)local_1b8,(Channel *)&local_358);
        if (!bVar58) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar22 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)local_358._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," xSampling ",0xb);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_1b8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_358._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," ySampling ",0xb);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,(_Rb_tree_color)uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
          poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)local_358._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," pLinear ",9);
          poVar22 = std::ostream::_M_insert<bool>(SUB81(poVar22,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar22,0));
          std::ostream::flush();
        }
        pCVar23 = Imf_2_5::Header::channels(pHVar29);
        other = Imf_2_5::Header::channels
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar56)
                          );
        bVar58 = Imf_2_5::ChannelList::operator==(pCVar23,other);
        if (!bVar58) {
          __assert_fail("header.channels() == headers[i].channels()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2a9,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        psVar39 = Imf_2_5::Header::name_abi_cxx11_(pHVar29);
        psVar40 = Imf_2_5::Header::name_abi_cxx11_
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        sVar57 = psVar39->_M_string_length;
        if ((sVar57 != psVar40->_M_string_length) ||
           ((sVar57 != 0 &&
            (iVar13 = bcmp((psVar39->_M_dataplus)._M_p,(psVar40->_M_dataplus)._M_p,sVar57),
            iVar13 != 0)))) {
          __assert_fail("header.name() == headers[i].name()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2aa,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        psVar39 = Imf_2_5::Header::type_abi_cxx11_(pHVar29);
        psVar40 = Imf_2_5::Header::type_abi_cxx11_
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar56));
        sVar57 = psVar39->_M_string_length;
        if ((sVar57 != psVar40->_M_string_length) ||
           ((sVar57 != 0 &&
            (iVar13 = bcmp((psVar39->_M_dataplus)._M_p,(psVar40->_M_dataplus)._M_p,sVar57),
            iVar13 != 0)))) {
          __assert_fail("header.type() == headers[i].type()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2ab,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar47 = uVar47 + 1;
        lVar56 = lVar56 + 0x38;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_358._data = (float *)0x0;
      uVar53 = ((long)DAT_0043ecc0 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      uVar55 = (uint)uVar53;
      if ((int)uVar55 < 1) {
LAB_00174df9:
        if (0 < (int)uVar55) {
          local_368 = (pointer *)(ulong)(uVar55 & 0x7fffffff);
          p_Var43 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0x0;
          do {
            iVar13 = *(int *)(local_358._sizeX + (long)p_Var43 * 4);
            lVar56 = (long)iVar13;
            local_378 = p_Var43;
            if (*(int *)((anonymous_namespace)::partTypes + lVar56 * 4) == 0) {
              uStack_1b0 = (Data *)((ulong)uStack_1b0._4_4_ << 0x20);
              local_1a8 = (_Base_ptr)0x0;
              local_1a0 = (_Base_ptr)&uStack_1b0;
              local_190 = 0;
              local_198 = local_1a0;
              setInputFrameBuffer((FrameBuffer *)local_1b8,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar56 * 4),
                                  (Array2D<unsigned_int> *)local_258,(Array2D<float> *)&local_398,
                                  &local_2d8,0xc5,0x107);
              Imf_2_5::InputPart::InputPart
                        ((InputPart *)&local_218,(MultiPartInputFile *)&local_2f8,iVar13);
              Imf_2_5::InputPart::setFrameBuffer((InputPart *)&local_218,(FrameBuffer *)local_1b8);
              Imf_2_5::InputPart::readPixels((InputPart *)&local_218,0,0x106);
              iVar13 = *(int *)((anonymous_namespace)::pixelTypes + lVar56 * 4);
              if (iVar13 == 0) {
                bVar58 = checkPixels<unsigned_int>
                                   ((Array2D<unsigned_int> *)local_258,0,0xc4,0,0x106,0xc5);
                if (!bVar58) {
                  __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                ,0x2d4,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar13 == 1) {
                bVar58 = checkPixels<float>((Array2D<float> *)&local_398,0,0xc4,0,0x106,0xc5);
                if (!bVar58) {
                  __assert_fail("checkPixels<float>(fData, width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                ,0x2d7,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar13 == 2) &&
                      (bVar58 = checkPixels<half>(&local_2d8,0,0xc4,0,0x106,0xc5), !bVar58)) {
                __assert_fail("checkPixels<half>(hData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                              ,0x2da,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else {
              uStack_1b0 = (Data *)((ulong)uStack_1b0._4_4_ << 0x20);
              local_1a8 = (_Base_ptr)0x0;
              local_1a0 = (_Base_ptr)&uStack_1b0;
              local_190 = 0;
              local_198 = local_1a0;
              Imf_2_5::TiledInputPart::TiledInputPart
                        ((TiledInputPart *)&local_218,(MultiPartInputFile *)&local_2f8,iVar13);
              iVar13 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&local_218);
              local_370 = CONCAT44(local_370._4_4_,iVar13);
              iVar13 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&local_218);
              if (0 < (int)local_370) {
                iVar14 = 0;
                do {
                  if (0 < iVar13) {
                    iVar19 = 0;
                    do {
                      bVar58 = Imf_2_5::TiledInputPart::isValidLevel
                                         ((TiledInputPart *)&local_218,iVar14,iVar19);
                      if (bVar58) {
                        iVar17 = Imf_2_5::TiledInputPart::levelWidth
                                           ((TiledInputPart *)&local_218,iVar14);
                        iVar18 = Imf_2_5::TiledInputPart::levelHeight
                                           ((TiledInputPart *)&local_218,iVar19);
                        setInputFrameBuffer((FrameBuffer *)local_1b8,
                                            *(int *)((anonymous_namespace)::pixelTypes + lVar56 * 4)
                                            ,(Array2D<unsigned_int> *)local_258,
                                            (Array2D<float> *)&local_398,&local_2d8,0xc5,0x107);
                        Imf_2_5::TiledInputPart::setFrameBuffer
                                  ((TiledInputPart *)&local_218,(FrameBuffer *)local_1b8);
                        iVar15 = Imf_2_5::TiledInputPart::numXTiles
                                           ((TiledInputPart *)&local_218,iVar14);
                        iVar21 = Imf_2_5::TiledInputPart::numYTiles
                                           ((TiledInputPart *)&local_218,iVar19);
                        Imf_2_5::TiledInputPart::readTiles
                                  ((TiledInputPart *)&local_218,0,iVar15 + -1,0,iVar21 + -1,iVar14,
                                   iVar19);
                        iVar15 = *(int *)((anonymous_namespace)::pixelTypes + lVar56 * 4);
                        if (iVar15 == 0) {
                          bVar58 = checkPixels<unsigned_int>
                                             ((Array2D<unsigned_int> *)local_258,0,iVar17 + -1,0,
                                              iVar18 + -1,iVar17);
                          if (!bVar58) {
                            __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                          ,0x2f7,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if (iVar15 == 1) {
                          bVar58 = checkPixels<float>((Array2D<float> *)&local_398,0,iVar17 + -1,0,
                                                      iVar18 + -1,iVar17);
                          if (!bVar58) {
                            __assert_fail("checkPixels<float>(fData, w, h)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                          ,0x2fa,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if ((iVar15 == 2) &&
                                (bVar58 = checkPixels<half>(&local_2d8,0,iVar17 + -1,0,iVar18 + -1,
                                                            iVar17), !bVar58)) {
                          __assert_fail("checkPixels<half>(hData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                        ,0x2fd,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar13 != iVar19);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_370);
              }
            }
            std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                         *)local_1b8);
            p_Var43 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)((long)&(local_378->_M_impl).super__Vector_impl_data._M_start + 1);
          } while (p_Var43 !=
                   (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                    *)local_368);
        }
      }
      else {
        fVar20 = 0.0;
        do {
          if ((float *)local_358._sizeY == local_358._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_358,(iterator)local_358._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(float *)local_358._sizeY = fVar20;
            local_358._sizeY = local_358._sizeY + 4;
          }
          fVar20 = (float)(local_1b8._0_4_ + 1);
          local_1b8._0_4_ = fVar20;
        } while ((int)fVar20 < (int)uVar55);
        uVar53 = uVar53 & 0xffffffff;
        if (0 < (int)uVar55) {
          do {
            iVar13 = random_int(uVar55);
            iVar14 = random_int(uVar55);
            uVar41 = *(undefined4 *)(local_358._sizeX + (long)iVar13 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar13 * 4) =
                 *(undefined4 *)(local_358._sizeX + (long)iVar14 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar14 * 4) = uVar41;
            uVar16 = (int)uVar53 - 1;
            uVar53 = (ulong)uVar16;
          } while (uVar16 != 0);
          goto LAB_00174df9;
        }
      }
      if ((void *)local_358._sizeX != (void *)0x0) {
        operator_delete((void *)local_358._sizeX,(long)local_358._data - local_358._sizeX);
      }
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_2f8);
      if (local_2d8._data != (half *)0x0) {
        operator_delete__(local_2d8._data);
      }
      if ((void *)local_398.field_2._M_allocated_capacity != (void *)0x0) {
        operator_delete__((void *)local_398.field_2._M_allocated_capacity);
      }
      if (local_248 != (_Base_ptr)0x0) {
        operator_delete__(local_248);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar12 = local_288[0];
      iVar13 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar12,iVar13,true);
      IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)local_258);
      this = (ThreadPool *)operator_new(0x10);
      IlmThread_2_5::ThreadPool::ThreadPool(this,0x20);
      iVar13 = local_260;
      if (0 < local_260) {
        do {
          pTVar28 = (Task *)operator_new(0x18);
          IlmThread_2_5::Task::Task(pTVar28,(TaskGroup *)local_258);
          *(undefined ***)pTVar28 = &PTR__Task_0043b248;
          *(undefined1 **)(pTVar28 + 0x10) = local_1b8;
          IlmThread_2_5::ThreadPool::addTask((Task *)this);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      (**(code **)(*(long *)this + 8))(this);
      IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)local_258);
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)local_1b8);
      remove((char *)local_288[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      iVar14 = local_25c;
      std::ostream::put('x');
      std::ostream::flush();
      std::ostream::flush();
      iVar13 = iVar14 + 1;
    } while (iVar14 + 1 != local_264);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (int partNumber,
               int runCount,
               int randomReadCount,
               const std::string & tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir +  "imf_test_multipart_api.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str());

        cout << endl << flush;
    }
}